

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2notes.cpp
# Opt level: O1

void printLegend(MidiFile *midifile)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  size_t sVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  char *pcVar8;
  char **ppcVar9;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%\n",0x40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "%% DATA LEGEND                                               %%\n",0x40);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%\n",0x40);
  switch(timetype) {
  case 1:
    pcVar8 = "% time unit: ticks\n";
    lVar5 = 0x13;
    break;
  case 2:
    pcVar8 = "% time unit: beat\n";
    lVar5 = 0x12;
    break;
  case 3:
    pcVar8 = "% time unit: seconds\n";
    goto LAB_00112c0e;
  case 4:
    pcVar8 = "% time unit: milliseconds\n";
    lVar5 = 0x1a;
    break;
  default:
    pcVar8 = "% time unit: unknown\n";
LAB_00112c0e:
    lVar5 = 0x15;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"% Ticks per quarter note: ",0x1a);
  iVar1 = smf::MidiFile::getTicksPerQuarterNote(midifile);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"% unused parameter marker: ",0x1b);
  poVar3 = std::ostream::_M_insert<double>(unused);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  uVar2 = (uint)((ulong)((long)legend_opcode.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)legend_opcode.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar2 < 1) {
    iVar1 = 0;
  }
  else {
    uVar6 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + legend_opcode.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar6];
      uVar6 = uVar6 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar6);
  }
  if (0 < iVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"% ",2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," opcodes are present in the data:\n",0x22);
    if (0 < (int)((ulong)((long)legend_opcode.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)legend_opcode.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2)) {
      iVar1 = 0;
      lVar5 = 0;
      do {
        if (legend_opcode.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5] != 0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"%\topcode ",9);
          if (iVar1 < 4000) {
            if (iVar1 == 1000) {
              poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,1000);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t= note\n",8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"%\t\tp1 = start time of note\n",0x1b);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"%\t\tp2 = opcode for note\n",0x18);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"%\t\tp3 = duration of note\n",0x19);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"%\t\tp4 = MIDI key number\n",0x18);
              lVar7 = 0x1d;
              pcVar8 = "%\t\tp5 = MIDI attack velocity\n";
            }
            else if (iVar1 == 2000) {
              poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,2000);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar3,"\t= continuous controller\n",0x19);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"%\t\tp1 = action time of controller\n",0x22);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"%\t\tp2 = opcode for controller\n",0x1e);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"%\t\tp3 = controller number\n",0x1a);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"%\t\tp4 = controller value\n",0x19);
              lVar7 = 0xf;
              pcVar8 = "%\t\tp5 = unused\n";
            }
            else {
              if (iVar1 != 3000) {
LAB_00112f85:
                poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
                lVar7 = 0xb;
                pcVar8 = "\t= unknown\n";
                goto LAB_001130c8;
              }
              poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,3000);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t= instrument\n",0xe);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"%\t\tp1 = start time of instrument on channel\n",
                         0x2c);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"%\t\tp2 = opcode for instrument\n",0x1e);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"%\t\tp3 = instrument number\n",0x1a);
              lVar7 = 0x12;
              pcVar8 = "%\t\tp4-p5 = unused\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"%\t\tp6 = MIDI channel\n",0x15);
            lVar7 = 0x1f;
            poVar3 = (ostream *)&std::cout;
            pcVar8 = "%\t\tp7 = MIDI-file track number\n";
          }
          else if (iVar1 == 4000) {
            poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,4000);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t= tempo change\n",0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"%\t\tp1 = start time of tempo\n",0x1c);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"%\t\tp2 = opcode for tempo\n",0x19);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"%\t\tp3 = number of beats per minute\n",0x23);
            lVar7 = 0x12;
            poVar3 = (ostream *)&std::cout;
            pcVar8 = "%\t\tp4-p7 = unused\n";
          }
          else {
            if (iVar1 == 5000) {
              poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,5000);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar3,"\t= meter signature\n",0x13);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"%\t\tp1 = start time of meter signature\n",0x26);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"%\t\tp2 = opcode for meter\n",0x19);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"%\t\tp3 = numerator of meter\n",0x1b);
              lVar7 = 0x1d;
              pcVar8 = "%\t\tp4 = denominator of meter\n";
            }
            else {
              if (iVar1 != 6000) goto LAB_00112f85;
              poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,6000);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t= key signature\n",0x11);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"%\t\tp1 = start time of key signature\n",0x24);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"%\t\tp2 = opcode for key signature\n",0x21);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "%\t\tp3 = number of sharps (positive) or flats (negative)\n",0x38);
              lVar7 = 0x20;
              pcVar8 = "%\t\tp4 = mode (0=major, 1=minor)\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar7);
            lVar7 = 0x12;
            poVar3 = (ostream *)&std::cout;
            pcVar8 = "%\t\tp5-p7 = unused\n";
          }
LAB_001130c8:
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar8,lVar7);
        }
        lVar5 = lVar5 + 1;
        iVar1 = iVar1 + 1000;
      } while (lVar5 < (int)((ulong)((long)legend_opcode.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_finish -
                                    (long)legend_opcode.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start) >> 2));
    }
  }
  uVar2 = (uint)((ulong)((long)legend_instr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)legend_instr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar2 < 1) {
    iVar1 = 0;
  }
  else {
    uVar6 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + legend_instr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar6];
      uVar6 = uVar6 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar6);
  }
  if (0 < iVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"% ",2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," instrument timbres are present in the data:\n",0x2d);
    if (0 < (int)((ulong)((long)legend_instr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)legend_instr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2)) {
      ppcVar9 = GMinstrument;
      lVar5 = 0;
      do {
        if (legend_instr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5] != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"%\tinstrument number ",0x14);
          poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t= ",3);
          pcVar8 = *ppcVar9;
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
          }
          else {
            sVar4 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar8,sVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
        }
        lVar5 = lVar5 + 1;
        ppcVar9 = ppcVar9 + 1;
      } while (lVar5 < (int)((ulong)((long)legend_instr.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_finish -
                                    (long)legend_instr.super__Vector_base<int,_std::allocator<int>_>
                                          ._M_impl.super__Vector_impl_data._M_start) >> 2));
    }
  }
  uVar2 = (uint)((ulong)((long)legend_controller.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)legend_controller.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar2 < 1) {
    iVar1 = 0;
  }
  else {
    uVar6 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + legend_controller.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar6];
      uVar6 = uVar6 + 1;
    } while ((uVar2 & 0x7fffffff) != uVar6);
  }
  if (0 < iVar1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"% ",2);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3," types of controllers are present in the data:\n",0x2f);
    if (0 < (int)((ulong)((long)legend_controller.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)legend_controller.super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 2)) {
      ppcVar9 = GMcontrollers;
      lVar5 = 0;
      do {
        if (legend_controller.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar5] != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"%\tcontroller ",0xd);
          pcVar8 = *ppcVar9;
          if (pcVar8 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1351f8);
          }
          else {
            sVar4 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar4);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        }
        lVar5 = lVar5 + 1;
        ppcVar9 = ppcVar9 + 1;
      } while (lVar5 < (int)((ulong)((long)legend_controller.
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_finish -
                                    (long)legend_controller.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start) >> 2));
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%\n",0x40);
  return;
}

Assistant:

void printLegend(MidiFile& midifile) {
   int sum = 0;
   int i;

   cout << "\n";
   cout << "%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%\n";
   cout << "%% DATA LEGEND                                               %%\n";
   cout << "%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%\n";
   switch (timetype) {
      case TICK: cout << "% time unit: ticks\n";         break;
      case BEAT: cout << "% time unit: beat\n";          break;
      case SEC:  cout << "% time unit: seconds\n";       break;
      case MSEC: cout << "% time unit: milliseconds\n";  break;
      default:   cout << "% time unit: unknown\n";

   }
   cout << "% Ticks per quarter note: " << midifile.getTicksPerQuarterNote()
        << "\n";
   cout << "% unused parameter marker: " << unused << "\n";
   // check for opcodes used in data:
   sum = 0;
   for (i=0; i<(int)legend_opcode.size(); i++) {
      sum += legend_opcode[i];
   }
   if (sum > 0) {
      cout << "% " << sum << " opcodes are present in the data:\n";
      for (i=0; i<(int)legend_opcode.size(); i++) {
         if (legend_opcode[i]) {
            switch (i*1000) {
               case OP_NOTE:
                  cout << "%\topcode " << OP_NOTE << "\t= note\n";
                  cout << "%\t\tp1 = start time of note\n";
                  cout << "%\t\tp2 = opcode for note\n";
                  cout << "%\t\tp3 = duration of note\n";
                  cout << "%\t\tp4 = MIDI key number\n";
                  cout << "%\t\tp5 = MIDI attack velocity\n";
                  cout << "%\t\tp6 = MIDI channel\n";
                  cout << "%\t\tp7 = MIDI-file track number\n";
                  break;
               case OP_TEMPO:
                  cout << "%\topcode " << OP_TEMPO << "\t= tempo change\n";
                  cout << "%\t\tp1 = start time of tempo\n";
                  cout << "%\t\tp2 = opcode for tempo\n";
                  cout << "%\t\tp3 = number of beats per minute\n";
                  cout << "%\t\tp4-p7 = unused\n";
                  break;
               case OP_CONTROL:
                  cout << "%\topcode " << OP_CONTROL
                       << "\t= continuous controller\n";
                  cout << "%\t\tp1 = action time of controller\n";
                  cout << "%\t\tp2 = opcode for controller\n";
                  cout << "%\t\tp3 = controller number\n";
                  cout << "%\t\tp4 = controller value\n";
                  cout << "%\t\tp5 = unused\n";
                  cout << "%\t\tp6 = MIDI channel\n";
                  cout << "%\t\tp7 = MIDI-file track number\n";
                  break;
               case OP_INSTR:
                  cout << "%\topcode " << OP_INSTR << "\t= instrument\n";
                  cout << "%\t\tp1 = start time of instrument on channel\n";
                  cout << "%\t\tp2 = opcode for instrument\n";
                  cout << "%\t\tp3 = instrument number\n";
                  cout << "%\t\tp4-p5 = unused\n";
                  cout << "%\t\tp6 = MIDI channel\n";
                  cout << "%\t\tp7 = MIDI-file track number\n";
                  break;
               case OP_METER:
                  cout << "%\topcode " << OP_METER << "\t= meter signature\n";
                  cout << "%\t\tp1 = start time of meter signature\n";
                  cout << "%\t\tp2 = opcode for meter\n";
                  cout << "%\t\tp3 = numerator of meter\n";
                  cout << "%\t\tp4 = denominator of meter\n";
                  cout << "%\t\tp5-p7 = unused\n";
                  break;
               case OP_KEYSIG:
                  cout << "%\topcode " << OP_KEYSIG << "\t= key signature\n";
                  cout << "%\t\tp1 = start time of key signature\n";
                  cout << "%\t\tp2 = opcode for key signature\n";
                  cout << "%\t\tp3 = number of sharps (positive) or flats (negative)\n";
                  cout << "%\t\tp4 = mode (0=major, 1=minor)\n";
                  cout << "%\t\tp5-p7 = unused\n";
                  break;
               default:
                  cout << "%\topcode " << i*1000 << "\t= unknown\n";
            }
         }
      }
   }


   // check for instruments to list:
   sum = 0;
   for (i=0; i<(int)legend_instr.size(); i++) {
      sum += legend_instr[i];
   }
   if (sum > 0) {
      cout << "% " << sum << " instrument timbres are present in the data:\n";
      for (i=0; i<(int)legend_instr.size(); i++) {
         if (legend_instr[i]) {
            cout << "%\tinstrument number " << i << "\t= "
                 << GMinstrument[i] << "\n";
         }
      }
   }

   // check for controllers to list:
   sum = 0;
   for (i=0; i<(int)legend_controller.size(); i++) {
      sum += legend_controller[i];
   }
   if (sum > 0) {
      cout << "% " << sum << " types of controllers are present in the data:\n";
      for (i=0; i<(int)legend_controller.size(); i++) {
         if (legend_controller[i]) {
            cout << "%\tcontroller " << GMcontrollers[i] << "\n";
         }
      }
   }

   cout << "%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%\n";

}